

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgba64 * qt_fetch_conical_gradient_template<GradientBase64,QRgba64>
                    (QRgba64 *buffer,QSpanData *data,int y,int x,int length)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QRgba64 *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  qreal angle_1;
  qreal rw;
  qreal angle;
  QRgba64 *end;
  qreal inv2pi;
  bool affine;
  qreal ry;
  qreal rx;
  QRgba64 *b;
  double in_stack_ffffffffffffff68;
  QGradientData *in_stack_ffffffffffffff70;
  double local_78;
  QRgba64 *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if ((*(double *)(in_RSI + 0x48) == 0.0) && (!NAN(*(double *)(in_RSI + 0x48)))) {
    bVar2 = *(double *)(in_RSI + 0x60) == 0.0;
  }
  local_20 = in_RDI;
  if (bVar2) {
    for (; local_20 < in_RDI + in_R8D; local_20 = local_20 + 1) {
      qAtan2<double,double>((double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      TVar3 = GradientBase64::fetchSingle(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_20->rgba = TVar3.rgba;
    }
  }
  else {
    local_78 = *(double *)(in_RSI + 0x48) * ((double)in_ECX + 0.5) +
               *(double *)(in_RSI + 0x60) * ((double)in_EDX + 0.5) + *(double *)(in_RSI + 0x68);
    if ((local_78 == 0.0) && (!NAN(local_78))) {
      local_78 = 1.0;
    }
    for (; local_20 < in_RDI + in_R8D; local_20 = local_20 + 1) {
      qAtan2<double,double>((double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      TVar3 = GradientBase64::fetchSingle(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_20->rgba = TVar3.rgba;
      local_78 = *(double *)(in_RSI + 0x48) + local_78;
      if ((local_78 == 0.0) && (!NAN(local_78))) {
        local_78 = *(double *)(in_RSI + 0x48) + local_78;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static inline const BlendType * QT_FASTCALL qt_fetch_conical_gradient_template(
        BlendType *buffer, const QSpanData *data,
        int y, int x, int length)
{
    const BlendType *b = buffer;
    qreal rx = data->m21 * (y + qreal(0.5))
               + data->dx + data->m11 * (x + qreal(0.5));
    qreal ry = data->m22 * (y + qreal(0.5))
               + data->dy + data->m12 * (x + qreal(0.5));
    bool affine = !data->m13 && !data->m23;

    const qreal inv2pi = M_1_PI / 2.0;

    const BlendType *end = buffer + length;
    if (affine) {
        rx -= data->gradient.conical.center.x;
        ry -= data->gradient.conical.center.y;
        while (buffer < end) {
            qreal angle = qAtan2(ry, rx) + data->gradient.conical.angle;

            *buffer = GradientBase::fetchSingle(data->gradient, 1 - angle * inv2pi);

            rx += data->m11;
            ry += data->m12;
            ++buffer;
        }
    } else {
        qreal rw = data->m23 * (y + qreal(0.5))
                   + data->m33 + data->m13 * (x + qreal(0.5));
        if (!rw)
            rw = 1;
        while (buffer < end) {
            qreal angle = qAtan2(ry/rw - data->gradient.conical.center.x,
                                rx/rw - data->gradient.conical.center.y)
                          + data->gradient.conical.angle;

            *buffer = GradientBase::fetchSingle(data->gradient, 1 - angle * inv2pi);

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
    return b;
}